

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

Token __thiscall slang::parsing::Lexer::lexNumericLiteral(Lexer *this)

{
  double dVar1;
  span<const_slang::logic_t,_18446744073709551615UL> digits_00;
  char cVar2;
  bool bVar3;
  uint8_t value_00;
  bool bVar4;
  byte bVar5;
  __extent_storage<18446744073709551615UL> _Var6;
  int *piVar7;
  pointer __nptr;
  size_type sVar8;
  Lexer *in_RDI;
  undefined1 auVar9 [16];
  Token TVar10;
  bitwidth_t bits;
  double bitsDbl;
  SVInt intVal;
  bool outOfRange;
  double value;
  char *end;
  bool any_1;
  int index;
  bool hasDecimal;
  char c;
  optional<slang::TimeUnit> timeSuffix;
  char c_2;
  bool any;
  anon_class_16_2_832c79d4 populateChars;
  char c_1;
  SmallVector<char,_40UL> floatChars;
  SmallVector<slang::logic_t,_40UL> digits;
  size_t startOfNum;
  int i;
  logic_t *in_stack_fffffffffffffe48;
  SmallVectorBase<slang::logic_t> *in_stack_fffffffffffffe50;
  SVInt *rhs;
  Lexer *in_stack_fffffffffffffe58;
  Diagnostic *in_stack_fffffffffffffe60;
  Lexer *in_stack_fffffffffffffe68;
  anon_class_16_2_832c79d4 *in_stack_fffffffffffffe70;
  DiagCode code;
  Lexer *in_stack_fffffffffffffec0;
  undefined6 in_stack_fffffffffffffec8;
  TokenKind in_stack_fffffffffffffece;
  Lexer *in_stack_fffffffffffffed0;
  TokenKind in_stack_fffffffffffffede;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  char *local_f0;
  undefined1 local_e5;
  _Optional_payload_base<slang::TimeUnit> local_e4;
  undefined1 local_e2;
  byte local_e1;
  int in_stack_ffffffffffffff20;
  bitwidth_t in_stack_ffffffffffffff24;
  char local_d7;
  logic_t local_bd [20];
  char local_a9;
  SmallVectorBase<char> local_a8 [2];
  SmallVectorBase<slang::logic_t> local_68;
  pointer in_stack_ffffffffffffffd0;
  int local_1c;
  Token local_10;
  
  for (local_1c = 0; (local_1c < 5 && (cVar2 = peek(in_RDI,local_1c), cVar2 == "1step"[local_1c]));
      local_1c = local_1c + 1) {
    if (local_1c == 4) {
      advance(in_RDI,5);
      TVar10 = create<>(in_stack_fffffffffffffec0,(TokenKind)((ulong)in_RDI >> 0x30));
      return TVar10;
    }
  }
  while (cVar2 = peek(in_RDI), cVar2 == '0') {
    advance(in_RDI);
  }
  _Var6._M_extent_value = currentOffset(in_RDI);
  SmallVector<slang::logic_t,_40UL>::SmallVector((SmallVector<slang::logic_t,_40UL> *)0x9f6eea);
  SmallVector<char,_40UL>::SmallVector((SmallVector<char,_40UL> *)0x9f6ef7);
  while( true ) {
    while (local_a9 = peek(in_RDI), local_a9 == '_') {
      advance(in_RDI);
    }
    bVar3 = isDecimalDigit(local_a9);
    if (!bVar3) break;
    value_00 = getDigitValue(local_a9);
    logic_t::logic_t(local_bd,value_00);
    SmallVectorBase<slang::logic_t>::push_back(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    advance(in_RDI);
  }
  cVar2 = peek(in_RDI);
  if (cVar2 == '.') {
    advance(in_RDI);
    lexNumericLiteral::anon_class_16_2_832c79d4::operator()(in_stack_fffffffffffffe70);
    SmallVectorBase<char>::push_back
              ((SmallVectorBase<char> *)in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48)
    ;
    bVar3 = false;
    while( true ) {
      while (cVar2 = peek(in_RDI), cVar2 == '_') {
        advance(in_RDI);
      }
      bVar4 = isDecimalDigit(cVar2);
      if (!bVar4) break;
      bVar3 = true;
      SmallVectorBase<char>::push_back
                ((SmallVectorBase<char> *)in_stack_fffffffffffffe50,
                 (char *)in_stack_fffffffffffffe48);
      advance(in_RDI);
    }
    if (!bVar3) {
      SmallVectorBase<char>::push_back
                ((SmallVectorBase<char> *)in_stack_fffffffffffffe50,
                 (char *)in_stack_fffffffffffffe48);
    }
  }
  std::optional<slang::TimeUnit>::optional((optional<slang::TimeUnit> *)0x9f7106);
  cVar2 = peek(in_RDI);
  if ((cVar2 == 'e') || (cVar2 == 'E')) {
    bVar3 = SmallVectorBase<char>::empty(local_a8);
    bVar5 = (bVar3 ^ 0xffU) & 1;
    if (bVar5 == 0) {
      lexNumericLiteral::anon_class_16_2_832c79d4::operator()(in_stack_fffffffffffffe70);
    }
    in_stack_ffffffffffffff24 = CONCAT13(0x65,(int3)in_stack_ffffffffffffff24);
    SmallVectorBase<char>::push_back
              ((SmallVectorBase<char> *)in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48)
    ;
    in_stack_ffffffffffffff20 = 1;
    local_d7 = peek(in_RDI,1);
    if ((local_d7 == '+') || (local_d7 == '-')) {
      SmallVectorBase<char>::push_back
                ((SmallVectorBase<char> *)in_stack_fffffffffffffe50,
                 (char *)in_stack_fffffffffffffe48);
      in_stack_ffffffffffffff20 = in_stack_ffffffffffffff20 + 1;
      local_d7 = peek(in_RDI,in_stack_ffffffffffffff20);
    }
    local_e1 = 0;
    while( true ) {
      while (local_d7 == '_') {
        in_stack_ffffffffffffff20 = in_stack_ffffffffffffff20 + 1;
        local_d7 = peek(in_RDI,in_stack_ffffffffffffff20);
      }
      bVar3 = isDecimalDigit(local_d7);
      code = SUB84((ulong)in_stack_fffffffffffffe70 >> 0x20,0);
      if (!bVar3) break;
      local_e1 = 1;
      SmallVectorBase<char>::push_back
                ((SmallVectorBase<char> *)in_stack_fffffffffffffe50,
                 (char *)in_stack_fffffffffffffe48);
      in_stack_ffffffffffffff20 = in_stack_ffffffffffffff20 + 1;
      local_d7 = peek(in_RDI,in_stack_ffffffffffffff20);
    }
    if (((local_e1 & 1) == 0) && (bVar5 == 0)) {
      SmallVectorBase<char>::clear((SmallVectorBase<char> *)in_stack_fffffffffffffe50);
    }
    else {
      advance(in_RDI,in_stack_ffffffffffffff20);
      if ((local_e1 & 1) == 0) {
        local_e2 = 0x31;
        SmallVectorBase<char>::push_back
                  ((SmallVectorBase<char> *)in_stack_fffffffffffffe50,
                   (char *)in_stack_fffffffffffffe48);
      }
    }
  }
  else {
    local_e4 = (_Optional_payload_base<slang::TimeUnit>)lexTimeLiteral(in_stack_fffffffffffffe58);
    bVar3 = std::optional::operator_cast_to_bool((optional<slang::TimeUnit> *)0x9f736c);
    if ((bVar3) && (bVar3 = SmallVectorBase<char>::empty(local_a8), bVar3)) {
      lexNumericLiteral::anon_class_16_2_832c79d4::operator()(in_stack_fffffffffffffe70);
    }
    code = SUB84((ulong)in_stack_fffffffffffffe70 >> 0x20,0);
  }
  bVar3 = SmallVectorBase<char>::empty(local_a8);
  if (bVar3) {
    SVInt::SVInt((SVInt *)0x9f748d);
    bVar3 = SmallVectorBase<slang::logic_t>::empty(&local_68);
    dVar1 = BitsPerDecimal;
    if (!bVar3) {
      sVar8 = SmallVectorBase<slang::logic_t>::size(&local_68);
      auVar9._8_4_ = (int)(sVar8 >> 0x20);
      auVar9._0_8_ = sVar8;
      auVar9._12_4_ = 0x45300000;
      dVar1 = ceil(dVar1 * ((auVar9._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)sVar8) - 4503599627370496.0)));
      if (16777215.0 < dVar1) {
        addDiag(in_stack_fffffffffffffe68,code,(size_t)in_stack_fffffffffffffe60);
        Diagnostic::operator<<<int>
                  (in_stack_fffffffffffffe60,(int)((ulong)in_stack_fffffffffffffe58 >> 0x20));
      }
      std::span<const_slang::logic_t,_18446744073709551615UL>::
      span<slang::SmallVector<slang::logic_t,_40UL>_&>
                ((span<const_slang::logic_t,_18446744073709551615UL> *)in_stack_fffffffffffffe60,
                 (SmallVector<slang::logic_t,_40UL> *)in_stack_fffffffffffffe58);
      rhs = (SVInt *)CONCAT26(in_stack_fffffffffffffece,in_stack_fffffffffffffec8);
      digits_00._M_extent._M_extent_value = _Var6._M_extent_value;
      digits_00._M_ptr = in_stack_ffffffffffffffd0;
      SVInt::fromDigits(in_stack_ffffffffffffff24,
                        (LiteralBase)((uint)in_stack_ffffffffffffff20 >> 0x18),
                        SUB41((uint)in_stack_ffffffffffffff20 >> 0x10,0),
                        SUB41((uint)in_stack_ffffffffffffff20 >> 8,0),digits_00);
      SVInt::operator=((SVInt *)in_stack_fffffffffffffe58,rhs);
      SVInt::~SVInt((SVInt *)in_stack_fffffffffffffe60);
      SVInt::shrinkToFit((SVInt *)in_stack_fffffffffffffe60);
    }
    local_10 = create<slang::SVInt&>
                         (in_stack_fffffffffffffed0,in_stack_fffffffffffffece,
                          (SVInt *)in_stack_fffffffffffffec0);
    SVInt::~SVInt(local_10._0_8_);
  }
  else {
    local_e5 = 0;
    SmallVectorBase<char>::push_back
              ((SmallVectorBase<char> *)in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48)
    ;
    piVar7 = __errno_location();
    *piVar7 = 0;
    __nptr = SmallVectorBase<char>::data(local_a8);
    strtod(__nptr,&local_f0);
    __errno_location();
    std::optional::operator_cast_to_bool((optional<slang::TimeUnit> *)0x9f7425);
    local_10 = create<double&,bool&,std::optional<slang::TimeUnit>&>
                         ((Lexer *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                          in_stack_fffffffffffffede,(double *)in_stack_fffffffffffffed0,
                          (bool *)CONCAT26(in_stack_fffffffffffffece,in_stack_fffffffffffffec8),
                          (optional<slang::TimeUnit> *)in_stack_fffffffffffffec0);
  }
  SmallVector<char,_40UL>::~SmallVector((SmallVector<char,_40UL> *)0x9f7672);
  SmallVector<slang::logic_t,_40UL>::~SmallVector((SmallVector<slang::logic_t,_40UL> *)0x9f767f);
  return local_10;
}

Assistant:

Token Lexer::lexNumericLiteral() {
    // have to check for the "1step" magic keyword
    static const char OneStepText[] = "1step";
    for (int i = 0; i < (int)sizeof(OneStepText) - 1; i++) {
        if (peek(i) != OneStepText[i])
            break;
        if (i == sizeof(OneStepText) - 2) {
            advance(sizeof(OneStepText) - 1);
            return create(TokenKind::OneStep);
        }
    }

    // scan past leading zeros
    while (peek() == '0')
        advance();

    // Keep track of digits as we iterate through them; convert them
    // into logic_t to pass into the SVInt parsing method. If it turns out
    // that this is actually a float, we'll go back and populate `floatChars`
    // instead. Since we expect many more ints than floats, it makes sense to
    // not waste time populating that array up front.
    size_t startOfNum = currentOffset();
    SmallVector<logic_t> digits;
    SmallVector<char> floatChars;

    while (true) {
        char c = peek();
        if (c == '_')
            advance();
        else if (!isDecimalDigit(c))
            break;
        else {
            digits.push_back(logic_t(getDigitValue(c)));
            advance();
        }
    }

    auto populateChars = [&]() {
        if (digits.empty())
            floatChars.push_back('0');
        else {
            for (auto d : digits)
                floatChars.push_back(char((char)d.value + '0'));
        }
    };

    // Check for fractional digits.
    if (peek() == '.') {
        advance();
        populateChars();
        floatChars.push_back('.');

        bool any = false;
        while (true) {
            char c = peek();
            if (c == '_')
                advance();
            else if (!isDecimalDigit(c))
                break;
            else {
                any = true;
                floatChars.push_back(c);
                advance();
            }
        }

        if (!any)
            floatChars.push_back('0');
    }

    // Check for an exponent. Note that this case can be indistinguishable from
    // the vector digits for a hex literal, so we can't issue any errors here if
    // we don't have a decimal point (from above).
    //
    // Consider this nasty case we need to support:
    // `FOO 3e+2
    // If `FOO is defined to be 'h this represents an expression: 62 + 2
    // Otherwise, this represents a real literal: 300.0

    std::optional<TimeUnit> timeSuffix;
    char c = peek();
    if (c == 'e' || c == 'E') {
        bool hasDecimal = !floatChars.empty();
        if (!hasDecimal)
            populateChars();

        floatChars.push_back('e');

        // skip over leading sign
        int index = 1;
        c = peek(index);
        if (c == '+' || c == '-') {
            floatChars.push_back(c);
            c = peek(++index);
        }

        bool any = false;
        while (true) {
            if (c == '_')
                c = peek(++index);
            else if (!isDecimalDigit(c))
                break;
            else {
                any = true;
                floatChars.push_back(c);
                c = peek(++index);
            }
        }

        if (any || hasDecimal) {
            advance(index);
            if (!any)
                floatChars.push_back('1');
        }
        else {
            // This isn't a float, it's probably a hex literal. Back up (by not calling advance)
            // and clear out the floatChars array so we don't think it should be a float.
            floatChars.clear();
        }
    }
    else {
        // Check for a time literal suffix directly adjacent. Time literal
        // values are always interpreted as doubles.
        timeSuffix = lexTimeLiteral();
        if (timeSuffix && floatChars.empty())
            populateChars();
    }

    if (!floatChars.empty()) {
        // We have a floating point result. Let the standard library do the heavy lifting of
        // converting and rounding correctly. Note that we depend on this code returning
        // 0 for underflow and +inf for overflow.
        floatChars.push_back('\0');

        char* end;
        errno = 0;
        double value = strtod(floatChars.data(), &end);
        SLANG_ASSERT(end == floatChars.end() - 1); // should never error

        // If we had an overflow or underflow, errno is now ERANGE. We can't warn here in case
        // this turns out to actually be a hex literal. Have the token carry this info so someone
        // can check it later if they care.
        bool outOfRange = errno == ERANGE;

        return create(timeSuffix ? TokenKind::TimeLiteral : TokenKind::RealLiteral, value,
                      outOfRange, timeSuffix);
    }

    // normal numeric literal
    SVInt intVal;
    if (!digits.empty()) {
        double bitsDbl = ceil(BitsPerDecimal * double(digits.size()));
        bitwidth_t bits;
        if (bitsDbl <= double(SVInt::MAX_BITS))
            bits = (bitwidth_t)bitsDbl;
        else {
            addDiag(diag::LiteralSizeTooLarge, startOfNum) << (int)SVInt::MAX_BITS;
            bits = SVInt::MAX_BITS;
        }

        intVal = SVInt::fromDigits(bits, LiteralBase::Decimal, false, false, digits);
        intVal.shrinkToFit();
    }

    return create(TokenKind::IntegerLiteral, intVal);
}